

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O0

void __thiscall
flow::diagnostics::Report::typeError<flow::LiteralType,flow::LiteralType>
          (Report *this,SourceLocation *sloc,string *f,LiteralType args,LiteralType args_1)

{
  LiteralType *in_R9;
  string_view format_str;
  basic_string_view<char> local_90;
  string local_80;
  SourceLocation local_60;
  LiteralType local_28;
  LiteralType local_24;
  LiteralType args_local_1;
  LiteralType args_local;
  string *f_local;
  SourceLocation *sloc_local;
  Report *this_local;
  
  local_28 = args_1;
  local_24 = args;
  _args_local_1 = f;
  f_local = &sloc->filename;
  sloc_local = (SourceLocation *)this;
  SourceLocation::SourceLocation(&local_60,sloc);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            (&local_90,_args_local_1);
  format_str.size_ = (size_t)&local_24;
  format_str.data_ = (char *)local_90.size_;
  fmt::v5::format<flow::LiteralType,flow::LiteralType>
            (&local_80,(v5 *)local_90.data_,format_str,&local_28,in_R9);
  emplace_back(this,TypeError,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  SourceLocation::~SourceLocation(&local_60);
  return;
}

Assistant:

void typeError(const SourceLocation& sloc, const std::string& f, Args... args) {
    emplace_back(Type::TypeError, sloc, fmt::format(f, std::move(args)...));
  }